

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall CDirectiveIncbin::CDirectiveIncbin(CDirectiveIncbin *this,ArgumentList *args)

{
  wstring *strFilename;
  int *Result;
  int *Result_00;
  pointer pEVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  wchar_t *text;
  wstring local_50;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveIncbin_00172a70;
  strFilename = &this->fileName;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = L'\0';
  getFullPathName(&local_50,
                  &((args->entries).
                    super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_start)->text);
  std::__cxx11::wstring::operator=((wstring *)strFilename,(wstring *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  bVar2 = fileExists(strFilename);
  if (!bVar2) {
    Logger::printError<std::__cxx11::wstring>(FatalError,L"File %s not found",strFilename);
    return;
  }
  iVar3 = fileSize(strFilename);
  pEVar1 = (args->entries).
           super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(args->entries).
                     super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 3) *
             -0x3333333333333333) < 2) {
    this->startAddress = 0;
    this->loadSize = iVar3;
  }
  else {
    Result = &this->startAddress;
    bVar2 = ConvertExpression(&pEVar1[1].text,Result);
    if (!bVar2) {
      text = L"Invalid start address %s";
LAB_0014069c:
      Logger::printError<std::__cxx11::wstring>
                (FatalError,text,
                 &(args->entries).
                  super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                  _M_impl.super__Vector_impl_data._M_start[1].text);
      return;
    }
    iVar4 = iVar3 - *Result;
    if (iVar4 == 0 || iVar3 < *Result) {
      Logger::printError<int>(Error,L"Start address 0x%08X after end of file",Result);
      return;
    }
    pEVar1 = (args->entries).
             super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>._M_impl.
             super__Vector_impl_data._M_start;
    Result_00 = &this->loadSize;
    if ((ulong)(((long)(args->entries).
                       super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 3) *
               -0x3333333333333333) < 3) {
      *Result_00 = iVar4;
    }
    else {
      bVar2 = ConvertExpression(&pEVar1[2].text,Result_00);
      if (!bVar2) {
        text = L"Invalid size %s";
        goto LAB_0014069c;
      }
      if (iVar3 < *Result_00 + *Result) {
        Logger::printError<>(Warning,L"Loading beyond file end, truncating");
        *Result_00 = iVar3 - *Result;
      }
    }
  }
  FileManager::advanceMemory(g_fileManager,(long)this->loadSize);
  return;
}

Assistant:

CDirectiveIncbin::CDirectiveIncbin(ArgumentList& args)
{
	fileName = getFullPathName(args[0].text);

	if (fileExists(fileName) == false)
	{
		Logger::printError(Logger::FatalError,L"File %s not found",fileName);
		return;
	}

	int inputFileSize = fileSize(fileName);
	if (args.size() >= 2)
	{
		// load start address
		if (ConvertExpression(args[1].text,startAddress) == false)
		{
			Logger::printError(Logger::FatalError,L"Invalid start address %s",args[1].text);
			return;
		}

		if (startAddress >= inputFileSize)
		{
			Logger::printError(Logger::Error,L"Start address 0x%08X after end of file",startAddress);
			return;
		}

		if (args.size() >= 3)
		{
			// load size too
			if (ConvertExpression(args[2].text,loadSize) == false)
			{
				Logger::printError(Logger::FatalError,L"Invalid size %s",args[1].text);
				return;
			}

			if (startAddress+loadSize > inputFileSize)
			{
				Logger::printError(Logger::Warning,L"Loading beyond file end, truncating");
				loadSize =  inputFileSize-startAddress;
			}
		} else {
			loadSize =  inputFileSize-startAddress;
		}
	} else {
		startAddress = 0;
		loadSize = inputFileSize;
	}

	g_fileManager->advanceMemory(loadSize);
}